

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

double __thiscall
free_format_parser::HMpsFF::getValue(HMpsFF *this,string *word,bool *is_nan,HighsInt id)

{
  ulong uVar1;
  double dVar2;
  string local_word;
  
  std::__cxx11::string::string((string *)&local_word,(string *)word);
  uVar1 = std::__cxx11::string::find((char *)&local_word,0x39b3da);
  if (uVar1 == 0xffffffffffffffff) {
    uVar1 = std::__cxx11::string::find((char *)&local_word,0x3b5e5e);
    if (uVar1 == 0xffffffffffffffff) goto LAB_002274c4;
  }
  std::__cxx11::string::replace((ulong)&local_word,uVar1,(char *)0x1);
LAB_002274c4:
  dVar2 = atof(local_word._M_dataplus._M_p);
  *is_nan = false;
  std::__cxx11::string::~string((string *)&local_word);
  return dVar2;
}

Assistant:

double HMpsFF::getValue(const std::string& word, bool& is_nan,
                        const HighsInt id) const {
  // Lambda to replace any d or D by E
  auto dD2e = [&](std::string& word) {
    size_t ix = word.find("D");
    if (ix != std::string::npos) {
      word.replace(ix, 1, "E");
    } else {
      ix = word.find("d");
      if (ix != std::string::npos) word.replace(ix, 1, "E");
    }
  };

  std::string local_word = word;
  dD2e(local_word);
  const double value = atof(local_word.c_str());
  is_nan = false;
  //  printf("value(%d) = %g\n", int(id), value);
  //  if (std::isnan(value)) return true;
  //  // atof('nan') yields 0 with some Windows compilers, so try a string
  //  // comparison
  //  std::string lower_word = word;
  //  if (str_tolower(lower_word) == "nan") return true;
  return value;
}